

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolSetup(SUNLinearSolver S,SUNMatrix A)

{
  undefined8 in_RSI;
  long in_RDI;
  int ier;
  undefined4 local_14;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x38) == 0) {
    local_14 = 0;
  }
  else {
    local_14 = (**(code **)(*(long *)(in_RDI + 8) + 0x38))(in_RDI,in_RSI);
  }
  return local_14;
}

Assistant:

int SUNLinSolSetup(SUNLinearSolver S, SUNMatrix A)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setup)
    ier = S->ops->setup(S, A);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}